

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O2

bool __thiscall
HighsSymmetryDetection::compareCurrentGraph
          (HighsSymmetryDetection *this,
          HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *otherGraph,HighsInt *wrongCell)

{
  HighsInt HVar1;
  int iVar2;
  pointer ppVar3;
  ValueType *pVVar4;
  HighsInt j;
  long lVar5;
  long lVar6;
  HighsInt i;
  long lVar7;
  KeyType local_4c;
  HighsInt *local_40;
  long local_38;
  
  local_40 = wrongCell;
  for (lVar7 = 0; local_38 = (long)this->numCol, lVar7 < local_38; lVar7 = lVar7 + 1) {
    HVar1 = (this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar7];
    lVar6 = (long)(this->Gstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar7];
    while (iVar2 = (this->Gend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar7], lVar5 = (long)iVar2, (int)lVar6 != iVar2
          ) {
      ppVar3 = (this->Gedge).
               super__Vector_base<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_4c.super__Tuple_impl<0UL,_int,_int,_unsigned_int>.
      super__Tuple_impl<1UL,_int,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int>.
      super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
           (_Head_base<2UL,_unsigned_int,_false>)ppVar3[lVar6].second;
      local_4c.super__Tuple_impl<0UL,_int,_int,_unsigned_int>.super__Head_base<0UL,_int,_false>.
      _M_head_impl = (this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[ppVar3[lVar6].first];
      local_4c.super__Tuple_impl<0UL,_int,_int,_unsigned_int>.
      super__Tuple_impl<1UL,_int,_unsigned_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
           HVar1;
      pVVar4 = HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::find(otherGraph,&local_4c);
      lVar6 = lVar6 + 1;
      if (pVVar4 == (ValueType *)0x0) goto LAB_002f746a;
    }
    while ((int)lVar5 !=
           (this->Gstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar7 + 1]) {
      ppVar3 = (this->Gedge).
               super__Vector_base<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_4c.super__Tuple_impl<0UL,_int,_int,_unsigned_int>.
      super__Tuple_impl<1UL,_int,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int>.
      super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
           (_Head_base<2UL,_unsigned_int,_false>)ppVar3[lVar5].second;
      local_4c.super__Tuple_impl<0UL,_int,_int,_unsigned_int>.super__Head_base<0UL,_int,_false>.
      _M_head_impl = ppVar3[lVar5].first;
      local_4c.super__Tuple_impl<0UL,_int,_int,_unsigned_int>.
      super__Tuple_impl<1UL,_int,_unsigned_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
           HVar1;
      pVVar4 = HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::find(otherGraph,&local_4c);
      lVar5 = lVar5 + 1;
      if (pVVar4 == (ValueType *)0x0) goto LAB_002f746a;
    }
  }
LAB_002f7476:
  return local_38 <= lVar7;
LAB_002f746a:
  *local_40 = HVar1;
  goto LAB_002f7476;
}

Assistant:

bool HighsSymmetryDetection::compareCurrentGraph(
    const HighsHashTable<std::tuple<HighsInt, HighsInt, HighsUInt>>& otherGraph,
    HighsInt& wrongCell) {
  for (HighsInt i = 0; i < numCol; ++i) {
    HighsInt colCell = vertexToCell[i];

    for (HighsInt j = Gstart[i]; j != Gend[i]; ++j)
      if (!otherGraph.find(std::make_tuple(vertexToCell[Gedge[j].first],
                                           colCell, Gedge[j].second))) {
        // return which cell does not match in its neighbourhood as this should
        // have been detected with the hashing it can very rarely happen due to
        // a hash collision. In such a case we want to backtrack to the last
        // time where we targeted this particular cell. Otherwise we could spent
        // a long time searching for a matching leave value until every
        // combination is exhausted and for each leave in this subtree the graph
        // comparison will fail on this edge.
        wrongCell = colCell;
        return false;
      }
    for (HighsInt j = Gend[i]; j != Gstart[i + 1]; ++j)
      if (!otherGraph.find(
              std::make_tuple(Gedge[j].first, colCell, Gedge[j].second))) {
        wrongCell = colCell;
        return false;
      }
  }

  return true;
}